

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MinimumValueCase::iterate(MinimumValueCase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  deBool dVar2;
  ContextType CVar3;
  int iVar4;
  ApiType requiredApiType;
  RenderContext *pRVar5;
  NotSupportedError *this_01;
  undefined4 extraout_var;
  TestLog *pTVar6;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  allocator<char> local_b1;
  int value;
  undefined1 local_90 [8];
  ResultCollector result;
  CallLogWrapper gl;
  MinimumValueCase *this_local;
  
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    CVar3.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(CVar3,(ApiType)(this->m_minimumVersion).m_bits);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar4 = (*pRVar5->_vptr_RenderContext[3])();
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::CallLogWrapper::CallLogWrapper
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
                 (Functions *)CONCAT44(extraout_var,iVar4),pTVar6);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&value," // ERROR: ",&local_b1);
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_90,pTVar6,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      std::allocator<char>::~allocator(&local_b1);
      pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      CVar3.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
      requiredApiType = glu::ApiType::es(3,2);
      bVar1 = glu::contextSupports(CVar3,requiredApiType);
      if (bVar1) {
        if (this->m_target == 0x92d0) {
          local_f8 = 1;
        }
        else {
          if (this->m_target == 0x92d6) {
            local_fc = 8;
          }
          else {
            if (this->m_target == 0x90da) {
              local_100 = 4;
            }
            else {
              local_100 = this->m_minValue;
            }
            local_fc = local_100;
          }
          local_f8 = local_fc;
        }
        local_104 = local_f8;
      }
      else {
        local_104 = this->m_minValue;
      }
      this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
      glu::CallLogWrapper::enableLogging(this_00,true);
      deqp::gls::StateQueryUtil::verifyStateIntegerMin
                ((ResultCollector *)local_90,this_00,this->m_target,local_104,this->m_verifierType);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_90,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_90);
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      return STOP;
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Test not supported in this context version.",
             "contextSupports(m_context.getRenderContext().getType(), m_minimumVersion)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIntegerStateQueryTests.cpp"
             ,0xcf);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

MinimumValueCase::IterateResult MinimumValueCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(m_context.getRenderContext().getType(), m_minimumVersion), "Test not supported in this context version.");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	// \note: In GL ES 3.2, the following targets have different limits as in 3.1
	const int				value	= contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2))
									? (m_target == GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS	? MAX_FRAG_ATOMIC_COUNTER_BUFFERS_GLES32	// 1
									: m_target == GL_MAX_FRAGMENT_ATOMIC_COUNTERS			? MAX_FRAG_ATOMIC_COUNTERS_GLES32			// 8
									: m_target == GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS		? MAX_FRAG_SHADER_STORAGE_BLOCKS_GLES32		// 4
									: m_minValue)
									: m_minValue;

	gl.enableLogging(true);
	verifyStateIntegerMin(result, gl, m_target, value, m_verifierType);

	result.setTestContextResult(m_testCtx);
	return STOP;
}